

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

int __thiscall
section_data::slice_vertical_angled(section_data *this,int *line_start,int *line_end,int *layer)

{
  intercept_data intercept;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  intercept_data tempy;
  double y_int;
  double m;
  double yb;
  double ya;
  double xa;
  int *layer_local;
  int *line_end_local;
  int *line_start_local;
  section_data *this_local;
  
  dVar1 = (double)*line_start;
  dVar2 = (double)line_start[1];
  dVar3 = (double)line_end[1];
  if (((((double)this->x1 <= dVar1) && (dVar1 <= (double)this->x2)) &&
      (((dVar4 = round((((double)this->y2 - (double)this->y1) /
                       ((double)this->x2 - (double)this->x1)) * (dVar1 - (double)this->x1) +
                       (double)this->y1), (double)this->y2 < (double)this->y1 &&
        (((double)this->y2 < dVar4 && (dVar4 < (double)this->y1)))) ||
       (((double)this->y1 < (double)this->y2 &&
        (((double)this->y1 < dVar4 && (dVar4 < (double)this->y2)))))))) &&
     (((dVar3 < dVar2 && ((dVar3 <= dVar4 && (dVar4 <= dVar2)))) ||
      ((dVar2 < dVar3 && ((dVar2 <= dVar4 && (dVar4 <= dVar3)))))))) {
    dVar2 = sqrt((dVar1 - (double)this->x1) * (dVar1 - (double)this->x1) +
                 (dVar4 - (double)this->y1) * (dVar4 - (double)this->y1));
    dVar2 = round(dVar2);
    intercept.y = (int)dVar4;
    intercept.x = (int)dVar1;
    intercept.dist = (int)dVar2;
    push_intercept(this,layer,intercept);
  }
  return 0;
}

Assistant:

int section_data::slice_vertical_angled(int line_start[2], int line_end[2],
                                        int &layer)
{
  double xa = (double)line_start[0];
  double ya = (double)line_start[1];
  double yb = (double)line_end[1];
  if ((xa >= (double)x1) && (xa <= (double)x2)) {
    double m = ((double)y2 - (double)y1) / ((double)x2 - (double)x1);
    double y_int = round(m * (xa - (double)x1) + (double)y1);
    if ((((double)y1 > (double)y2) && (y_int > (double)y2) &&
         (y_int < (double)y1)) ||
        (((double)y1 < (double)y2) && (y_int > (double)y1) &&
         y_int < (double)y2)) {
      if (((ya > yb) && (y_int >= yb) && (y_int <= ya)) ||
          ((ya < yb) && (y_int >= ya) && (y_int <= yb))) {
        intercept_data tempy;
        tempy.x = (int)xa;
        tempy.y = (int)y_int;
        tempy.dist =
            (int)round((sqrt((xa - (double)x1) * (xa - (double)x1) +
                             (y_int - (double)y1) * (y_int - (double)y1))));
        push_intercept(layer, tempy);
      }
    }
  }
  return EXIT_SUCCESS;
}